

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolordialog.cpp
# Opt level: O2

void __thiscall QColorDialogPrivate::releaseColorPicking(QColorDialogPrivate *this)

{
  QWidget *this_00;
  QLabel *this_01;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  QtPrivate::QColorPicker::setCrossVisible(this->cp,true);
  QObject::removeEventFilter(&this_00->super_QObject);
  QWidget::releaseMouse(this_00);
  QWidget::releaseKeyboard(this_00);
  QWidget::setMouseTracking(this_00,false);
  this_01 = this->lblScreenColorInfo;
  latin1.m_data = "\n";
  latin1.m_size = 1;
  QString::QString((QString *)&QStack_38,latin1);
  QLabel::setText(this_01,(QString *)&QStack_38);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
  QWidget::setDisabled((QWidget *)this->addCusBt,false);
  QWidget::setDisabled(&this->buttons->super_QWidget,false);
  QWidget::setDisabled((QWidget *)this->eyeDropperButton,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColorDialogPrivate::releaseColorPicking()
{
    Q_Q(QColorDialog);
    cp->setCrossVisible(true);
    q->removeEventFilter(colorPickingEventFilter);
    q->releaseMouse();
#ifdef Q_OS_WIN32
    updateTimer->stop();
    dummyTransparentWindow.setVisible(false);
#endif
    q->releaseKeyboard();
    q->setMouseTracking(false);
    lblScreenColorInfo->setText("\n"_L1);
    addCusBt->setDisabled(false);
    buttons->setDisabled(false);
    eyeDropperButton->setDisabled(false);
}